

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::ImplicitAnsiPortSyntax::setChild
          (ImplicitAnsiPortSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  long in_RSI;
  long in_RDI;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_ffffffffffffffa8;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_ffffffffffffffb0;
  DeclaratorSyntax *local_30;
  not_null<slang::syntax::DeclaratorSyntax_*> local_28;
  PortHeaderSyntax *local_20;
  not_null<slang::syntax::PortHeaderSyntax_*> local_18 [3];
  
  if (in_RSI == 0) {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x7a541f);
    SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>(pSVar1);
    SyntaxList<slang::syntax::AttributeInstanceSyntax>::operator=
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  else if (in_RSI == 1) {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x7a5447);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_20 = (PortHeaderSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x7a5457);
      local_20 = SyntaxNode::as<slang::syntax::PortHeaderSyntax>(pSVar1);
    }
    not_null<slang::syntax::PortHeaderSyntax_*>::not_null<slang::syntax::PortHeaderSyntax_*>
              (local_18,&local_20);
    *(PortHeaderSyntax **)(in_RDI + 0x50) = local_18[0].ptr;
  }
  else {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x7a54a2);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_30 = (DeclaratorSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x7a54b2);
      local_30 = SyntaxNode::as<slang::syntax::DeclaratorSyntax>(pSVar1);
    }
    not_null<slang::syntax::DeclaratorSyntax_*>::not_null<slang::syntax::DeclaratorSyntax_*>
              (&local_28,&local_30);
    *(DeclaratorSyntax **)(in_RDI + 0x58) = local_28.ptr;
  }
  return;
}

Assistant:

void ImplicitAnsiPortSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: header = child.node() ? &child.node()->as<PortHeaderSyntax>() : nullptr; return;
        case 2: declarator = child.node() ? &child.node()->as<DeclaratorSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}